

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O1

void __thiscall
mocker::nasm::Section::
emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
          (Section *this,OpType *args,shared_ptr<mocker::nasm::Addr> *args_1,
          shared_ptr<mocker::nasm::Addr> *args_2)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  emplaceLine<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
            (this,&local_50,args,args_1,args_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    emplaceLine<Type>("", std::forward<Args>(args)...);
  }